

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

int __thiscall cmCTestScriptHandler::BackupDirectories(cmCTestScriptHandler *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  cmAlphaNum local_120;
  cmAlphaNum local_f0;
  string local_c0;
  cmAlphaNum local_a0;
  cmAlphaNum local_70;
  string local_40;
  int local_1c;
  cmCTestScriptHandler *pcStack_18;
  int retVal;
  cmCTestScriptHandler *this_local;
  
  pcStack_18 = this;
  cmAlphaNum::cmAlphaNum(&local_70,&this->SourceDir);
  cmAlphaNum::cmAlphaNum(&local_a0,"_CMakeBackup");
  cmStrCat<>(&local_40,&local_70,&local_a0);
  std::__cxx11::string::operator=((string *)&this->BackupSourceDir,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  cmAlphaNum::cmAlphaNum(&local_f0,&this->BinaryDir);
  cmAlphaNum::cmAlphaNum(&local_120,"_CMakeBackup");
  cmStrCat<>(&local_c0,&local_f0,&local_120);
  std::__cxx11::string::operator=((string *)&this->BackupBinaryDir,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  if ((this->Backup & 1U) != 0) {
    bVar1 = cmsys::SystemTools::FileExists(&this->BackupSourceDir);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&this->BackupSourceDir);
    }
    bVar1 = cmsys::SystemTools::FileExists(&this->BackupBinaryDir);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory(&this->BackupBinaryDir);
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    rename(pcVar2,pcVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    rename(pcVar2,pcVar3);
    local_1c = CheckOutSourceDir(this);
    if (local_1c != 0) {
      RestoreBackupDirectories(this);
      return local_1c;
    }
  }
  return 0;
}

Assistant:

int cmCTestScriptHandler::BackupDirectories()
{
  int retVal;

  // compute the backup names
  this->BackupSourceDir = cmStrCat(this->SourceDir, "_CMakeBackup");
  this->BackupBinaryDir = cmStrCat(this->BinaryDir, "_CMakeBackup");

  // backup the binary and src directories if requested
  if (this->Backup) {
    // if for some reason those directories exist then first delete them
    if (cmSystemTools::FileExists(this->BackupSourceDir)) {
      cmSystemTools::RemoveADirectory(this->BackupSourceDir);
    }
    if (cmSystemTools::FileExists(this->BackupBinaryDir)) {
      cmSystemTools::RemoveADirectory(this->BackupBinaryDir);
    }

    // first rename the src and binary directories
    rename(this->SourceDir.c_str(), this->BackupSourceDir.c_str());
    rename(this->BinaryDir.c_str(), this->BackupBinaryDir.c_str());

    // we must now checkout the src dir
    retVal = this->CheckOutSourceDir();
    if (retVal) {
      this->RestoreBackupDirectories();
      return retVal;
    }
  }

  return 0;
}